

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

MatrixShaderEvalFunc
deqp::gles3::Functional::MatrixCaseUtils::getEvalFunc(ShaderInput *in0,ShaderInput *in1,MatrixOp op)

{
  DataType DVar1;
  
  DVar1 = in0->dataType << 7 | op << 0xe | in1->dataType;
  switch(DVar1) {
  case 0x8281:
    return Evaluator<2,_5,_1>::evaluate;
  case 0x8282:
    return Evaluator<2,_5,_2>::evaluate;
  case 0x8283:
  case 0x8284:
  case 0x8286:
  case 0x8287:
  case 0x8289:
  case 0x828a:
    goto switchD_00f98d77_caseD_8685;
  case 0x8285:
    return Evaluator<2,_5,_5>::evaluate;
  case 0x8288:
    return Evaluator<2,_5,_8>::evaluate;
  case 0x828b:
    return Evaluator<2,_5,_11>::evaluate;
  default:
    switch(DVar1) {
    case 0x8301:
      return Evaluator<2,_6,_1>::evaluate;
    case 0x8302:
      return Evaluator<2,_6,_2>::evaluate;
    case 0x8303:
    case 0x8304:
    case 0x8306:
    case 0x8307:
    case 0x8309:
    case 0x830a:
      break;
    case 0x8305:
      return Evaluator<2,_6,_5>::evaluate;
    case 0x8308:
      return Evaluator<2,_6,_8>::evaluate;
    case 0x830b:
      return Evaluator<2,_6,_11>::evaluate;
    default:
      switch(DVar1) {
      case 0x8381:
        return Evaluator<2,_7,_1>::evaluate;
      case 0x8382:
        return Evaluator<2,_7,_2>::evaluate;
      case 0x8383:
      case 0x8384:
      case 0x8386:
      case 0x8387:
      case 0x8389:
      case 0x838a:
        break;
      case 0x8385:
        return Evaluator<2,_7,_5>::evaluate;
      case 0x8388:
        return Evaluator<2,_7,_8>::evaluate;
      case 0x838b:
        return Evaluator<2,_7,_11>::evaluate;
      default:
        switch(DVar1) {
        case 0x8401:
          return Evaluator<2,_8,_1>::evaluate;
        case 0x8402:
        case 0x8404:
        case 0x8405:
        case 0x8407:
        case 0x8408:
        case 0x840a:
        case 0x840b:
          break;
        case 0x8403:
          return Evaluator<2,_8,_3>::evaluate;
        case 0x8406:
          return Evaluator<2,_8,_6>::evaluate;
        case 0x8409:
          return Evaluator<2,_8,_9>::evaluate;
        case 0x840c:
          return Evaluator<2,_8,_12>::evaluate;
        default:
          switch(DVar1) {
          case 0x8481:
            return Evaluator<2,_9,_1>::evaluate;
          case 0x8482:
          case 0x8484:
          case 0x8485:
          case 0x8487:
          case 0x8488:
          case 0x848a:
          case 0x848b:
            break;
          case 0x8483:
            return Evaluator<2,_9,_3>::evaluate;
          case 0x8486:
            return Evaluator<2,_9,_6>::evaluate;
          case 0x8489:
            return Evaluator<2,_9,_9>::evaluate;
          case 0x848c:
            return Evaluator<2,_9,_12>::evaluate;
          default:
            switch(DVar1) {
            case 0x8501:
              return Evaluator<2,_10,_1>::evaluate;
            case 0x8502:
            case 0x8504:
            case 0x8505:
            case 0x8507:
            case 0x8508:
            case 0x850a:
            case 0x850b:
              break;
            case 0x8503:
              return Evaluator<2,_10,_3>::evaluate;
            case 0x8506:
              return Evaluator<2,_10,_6>::evaluate;
            case 0x8509:
              return Evaluator<2,_10,_9>::evaluate;
            case 0x850c:
              return Evaluator<2,_10,_12>::evaluate;
            default:
              switch(DVar1) {
              case 0x8584:
                return Evaluator<2,_11,_4>::evaluate;
              case 0x8585:
              case 0x8586:
              case 0x8588:
              case 0x8589:
              case 0x858b:
              case 0x858c:
                break;
              case 0x8587:
                return Evaluator<2,_11,_7>::evaluate;
              case 0x858a:
                return Evaluator<2,_11,_10>::evaluate;
              case 0x858d:
                return Evaluator<2,_11,_13>::evaluate;
              default:
                switch(DVar1) {
                case 0x8604:
                  return Evaluator<2,_12,_4>::evaluate;
                case 0x8605:
                case 0x8606:
                case 0x8608:
                case 0x8609:
                case 0x860b:
                case 0x860c:
                  break;
                case 0x8607:
                  return Evaluator<2,_12,_7>::evaluate;
                case 0x860a:
                  return Evaluator<2,_12,_10>::evaluate;
                case 0x860d:
                  return Evaluator<2,_12,_13>::evaluate;
                default:
                  switch(DVar1) {
                  case 0x8684:
                    return Evaluator<2,_13,_4>::evaluate;
                  case 0x8685:
                  case 0x8686:
                  case 0x8688:
                  case 0x8689:
                  case 0x868b:
                  case 0x868c:
                    break;
                  case 0x8687:
                    return Evaluator<2,_13,_7>::evaluate;
                  case 0x868a:
                    return Evaluator<2,_13,_10>::evaluate;
                  case 0x868d:
                    return Evaluator<2,_13,_13>::evaluate;
                  default:
                    if (DVar1 == 0x281) {
                      return Evaluator<0,_5,_1>::evaluate;
                    }
                    if (DVar1 == 0x285) {
                      return Evaluator<0,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x301) {
                      return Evaluator<0,_6,_1>::evaluate;
                    }
                    if (DVar1 == 0x306) {
                      return Evaluator<0,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x381) {
                      return Evaluator<0,_7,_1>::evaluate;
                    }
                    if (DVar1 == 0x387) {
                      return Evaluator<0,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x401) {
                      return Evaluator<0,_8,_1>::evaluate;
                    }
                    if (DVar1 == 0x408) {
                      return Evaluator<0,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x481) {
                      return Evaluator<0,_9,_1>::evaluate;
                    }
                    if (DVar1 == 0x489) {
                      return Evaluator<0,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x501) {
                      return Evaluator<0,_10,_1>::evaluate;
                    }
                    if (DVar1 == 0x50a) {
                      return Evaluator<0,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x581) {
                      return Evaluator<0,_11,_1>::evaluate;
                    }
                    if (DVar1 == 0x58b) {
                      return Evaluator<0,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x601) {
                      return Evaluator<0,_12,_1>::evaluate;
                    }
                    if (DVar1 == 0x60c) {
                      return Evaluator<0,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x681) {
                      return Evaluator<0,_13,_1>::evaluate;
                    }
                    if (DVar1 == 0x68d) {
                      return Evaluator<0,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x4868d) {
                      return Evaluator<18,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x4285) {
                      return Evaluator<1,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x4301) {
                      return Evaluator<1,_6,_1>::evaluate;
                    }
                    if (DVar1 == 0x4306) {
                      return Evaluator<1,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x4381) {
                      return Evaluator<1,_7,_1>::evaluate;
                    }
                    if (DVar1 == 0x4387) {
                      return Evaluator<1,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x4401) {
                      return Evaluator<1,_8,_1>::evaluate;
                    }
                    if (DVar1 == 0x4408) {
                      return Evaluator<1,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x4481) {
                      return Evaluator<1,_9,_1>::evaluate;
                    }
                    if (DVar1 == 0x4489) {
                      return Evaluator<1,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x4501) {
                      return Evaluator<1,_10,_1>::evaluate;
                    }
                    if (DVar1 == 0x450a) {
                      return Evaluator<1,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x4581) {
                      return Evaluator<1,_11,_1>::evaluate;
                    }
                    if (DVar1 == 0x458b) {
                      return Evaluator<1,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x4601) {
                      return Evaluator<1,_12,_1>::evaluate;
                    }
                    if (DVar1 == 0x460c) {
                      return Evaluator<1,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x4681) {
                      return Evaluator<1,_13,_1>::evaluate;
                    }
                    if (DVar1 == 0x468d) {
                      return Evaluator<1,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x8105) {
                      return Evaluator<2,_2,_5>::evaluate;
                    }
                    if (DVar1 == 0x8108) {
                      return Evaluator<2,_2,_8>::evaluate;
                    }
                    if (DVar1 == 0x810b) {
                      return Evaluator<2,_2,_11>::evaluate;
                    }
                    if (DVar1 == 0x8186) {
                      return Evaluator<2,_3,_6>::evaluate;
                    }
                    if (DVar1 == 0x8189) {
                      return Evaluator<2,_3,_9>::evaluate;
                    }
                    if (DVar1 == 0x818c) {
                      return Evaluator<2,_3,_12>::evaluate;
                    }
                    if (DVar1 == 0x8207) {
                      return Evaluator<2,_4,_7>::evaluate;
                    }
                    if (DVar1 == 0x820a) {
                      return Evaluator<2,_4,_10>::evaluate;
                    }
                    if (DVar1 == 0x820d) {
                      return Evaluator<2,_4,_13>::evaluate;
                    }
                    if (DVar1 == 0x8581) {
                      return Evaluator<2,_11,_1>::evaluate;
                    }
                    if (DVar1 == 0x8601) {
                      return Evaluator<2,_12,_1>::evaluate;
                    }
                    if (DVar1 == 0x8681) {
                      return Evaluator<2,_13,_1>::evaluate;
                    }
                    if (DVar1 == 0xc281) {
                      return Evaluator<3,_5,_1>::evaluate;
                    }
                    if (DVar1 == 0xc285) {
                      return Evaluator<3,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0xc301) {
                      return Evaluator<3,_6,_1>::evaluate;
                    }
                    if (DVar1 == 0xc306) {
                      return Evaluator<3,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0xc381) {
                      return Evaluator<3,_7,_1>::evaluate;
                    }
                    if (DVar1 == 0xc387) {
                      return Evaluator<3,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0xc401) {
                      return Evaluator<3,_8,_1>::evaluate;
                    }
                    if (DVar1 == 0xc408) {
                      return Evaluator<3,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0xc481) {
                      return Evaluator<3,_9,_1>::evaluate;
                    }
                    if (DVar1 == 0xc489) {
                      return Evaluator<3,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0xc501) {
                      return Evaluator<3,_10,_1>::evaluate;
                    }
                    if (DVar1 == 0xc50a) {
                      return Evaluator<3,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0xc581) {
                      return Evaluator<3,_11,_1>::evaluate;
                    }
                    if (DVar1 == 0xc58b) {
                      return Evaluator<3,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0xc601) {
                      return Evaluator<3,_12,_1>::evaluate;
                    }
                    if (DVar1 == 0xc60c) {
                      return Evaluator<3,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0xc681) {
                      return Evaluator<3,_13,_1>::evaluate;
                    }
                    if (DVar1 == 0xc68d) {
                      return Evaluator<3,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x10285) {
                      return Evaluator<4,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x10306) {
                      return Evaluator<4,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x10387) {
                      return Evaluator<4,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x10408) {
                      return Evaluator<4,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x10489) {
                      return Evaluator<4,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x1050a) {
                      return Evaluator<4,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x1058b) {
                      return Evaluator<4,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x1060c) {
                      return Evaluator<4,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x1068d) {
                      return Evaluator<4,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x14102) {
                      return Evaluator<5,_2,_2>::evaluate;
                    }
                    if (DVar1 == 0x14103) {
                      return Evaluator<5,_2,_3>::evaluate;
                    }
                    if (DVar1 == 0x14104) {
                      return Evaluator<5,_2,_4>::evaluate;
                    }
                    if (DVar1 == 0x14182) {
                      return Evaluator<5,_3,_2>::evaluate;
                    }
                    if (DVar1 == 0x14183) {
                      return Evaluator<5,_3,_3>::evaluate;
                    }
                    if (DVar1 == 0x14184) {
                      return Evaluator<5,_3,_4>::evaluate;
                    }
                    if (DVar1 == 0x14202) {
                      return Evaluator<5,_4,_2>::evaluate;
                    }
                    if (DVar1 == 0x14203) {
                      return Evaluator<5,_4,_3>::evaluate;
                    }
                    if (DVar1 == 0x14204) {
                      return Evaluator<5,_4,_4>::evaluate;
                    }
                    if (DVar1 == 0x182de) {
                      return Evaluator<6,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x1835e) {
                      return Evaluator<6,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x183de) {
                      return Evaluator<6,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x1845e) {
                      return Evaluator<6,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x184de) {
                      return Evaluator<6,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x1855e) {
                      return Evaluator<6,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x185de) {
                      return Evaluator<6,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x1865e) {
                      return Evaluator<6,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x186de) {
                      return Evaluator<6,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x1c2de) {
                      return Evaluator<7,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x1c4de) {
                      return Evaluator<7,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x1c6de) {
                      return Evaluator<7,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x202de) {
                      return Evaluator<8,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x204de) {
                      return Evaluator<8,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x206de) {
                      return Evaluator<8,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x242de) {
                      return Evaluator<9,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x2435e) {
                      return Evaluator<9,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x243de) {
                      return Evaluator<9,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x2445e) {
                      return Evaluator<9,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x244de) {
                      return Evaluator<9,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x2455e) {
                      return Evaluator<9,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x245de) {
                      return Evaluator<9,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x2465e) {
                      return Evaluator<9,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x246de) {
                      return Evaluator<9,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x282de) {
                      return Evaluator<10,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x2835e) {
                      return Evaluator<10,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x283de) {
                      return Evaluator<10,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x2845e) {
                      return Evaluator<10,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x284de) {
                      return Evaluator<10,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x2855e) {
                      return Evaluator<10,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x285de) {
                      return Evaluator<10,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x2865e) {
                      return Evaluator<10,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x286de) {
                      return Evaluator<10,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c2de) {
                      return Evaluator<11,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c35e) {
                      return Evaluator<11,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c3de) {
                      return Evaluator<11,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c45e) {
                      return Evaluator<11,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c4de) {
                      return Evaluator<11,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c55e) {
                      return Evaluator<11,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c5de) {
                      return Evaluator<11,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c65e) {
                      return Evaluator<11,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x2c6de) {
                      return Evaluator<11,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x302de) {
                      return Evaluator<12,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x3035e) {
                      return Evaluator<12,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x303de) {
                      return Evaluator<12,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x3045e) {
                      return Evaluator<12,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x304de) {
                      return Evaluator<12,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x3055e) {
                      return Evaluator<12,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x305de) {
                      return Evaluator<12,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x3065e) {
                      return Evaluator<12,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x306de) {
                      return Evaluator<12,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x342de) {
                      return Evaluator<13,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x3435e) {
                      return Evaluator<13,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x343de) {
                      return Evaluator<13,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x3445e) {
                      return Evaluator<13,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x344de) {
                      return Evaluator<13,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x3455e) {
                      return Evaluator<13,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x345de) {
                      return Evaluator<13,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x3465e) {
                      return Evaluator<13,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x346de) {
                      return Evaluator<13,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x382de) {
                      return Evaluator<14,_5,_94>::evaluate;
                    }
                    if (DVar1 == 0x3835e) {
                      return Evaluator<14,_6,_94>::evaluate;
                    }
                    if (DVar1 == 0x383de) {
                      return Evaluator<14,_7,_94>::evaluate;
                    }
                    if (DVar1 == 0x3845e) {
                      return Evaluator<14,_8,_94>::evaluate;
                    }
                    if (DVar1 == 0x384de) {
                      return Evaluator<14,_9,_94>::evaluate;
                    }
                    if (DVar1 == 0x3855e) {
                      return Evaluator<14,_10,_94>::evaluate;
                    }
                    if (DVar1 == 0x385de) {
                      return Evaluator<14,_11,_94>::evaluate;
                    }
                    if (DVar1 == 0x3865e) {
                      return Evaluator<14,_12,_94>::evaluate;
                    }
                    if (DVar1 == 0x386de) {
                      return Evaluator<14,_13,_94>::evaluate;
                    }
                    if (DVar1 == 0x3c285) {
                      return Evaluator<15,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x3c306) {
                      return Evaluator<15,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x3c387) {
                      return Evaluator<15,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x3c408) {
                      return Evaluator<15,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x3c489) {
                      return Evaluator<15,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x3c50a) {
                      return Evaluator<15,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x3c58b) {
                      return Evaluator<15,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x3c60c) {
                      return Evaluator<15,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x3c68d) {
                      return Evaluator<15,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x40285) {
                      return Evaluator<16,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x40306) {
                      return Evaluator<16,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x40387) {
                      return Evaluator<16,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x40408) {
                      return Evaluator<16,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x40489) {
                      return Evaluator<16,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x4050a) {
                      return Evaluator<16,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x4058b) {
                      return Evaluator<16,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x4060c) {
                      return Evaluator<16,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x4068d) {
                      return Evaluator<16,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x44285) {
                      return Evaluator<17,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x44489) {
                      return Evaluator<17,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x4468d) {
                      return Evaluator<17,_13,_13>::evaluate;
                    }
                    if (DVar1 == 0x48285) {
                      return Evaluator<18,_5,_5>::evaluate;
                    }
                    if (DVar1 == 0x48306) {
                      return Evaluator<18,_6,_6>::evaluate;
                    }
                    if (DVar1 == 0x48387) {
                      return Evaluator<18,_7,_7>::evaluate;
                    }
                    if (DVar1 == 0x48408) {
                      return Evaluator<18,_8,_8>::evaluate;
                    }
                    if (DVar1 == 0x48489) {
                      return Evaluator<18,_9,_9>::evaluate;
                    }
                    if (DVar1 == 0x4850a) {
                      return Evaluator<18,_10,_10>::evaluate;
                    }
                    if (DVar1 == 0x4858b) {
                      return Evaluator<18,_11,_11>::evaluate;
                    }
                    if (DVar1 == 0x4860c) {
                      return Evaluator<18,_12,_12>::evaluate;
                    }
                    if (DVar1 == 0x4281) {
                      return Evaluator<1,_5,_1>::evaluate;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
switchD_00f98d77_caseD_8685:
    return (MatrixShaderEvalFunc)0x0;
  }
}

Assistant:

MatrixShaderEvalFunc getEvalFunc (const ShaderInput& in0, const ShaderInput& in1, MatrixOp op)
{
	// Evaluator is selected based on op and input data types.
	// For efficient lookup the types and op enums are packed together to form a 19-bit key:
	// [18..14 OP] [13..7 TYPE0] [6..0 TYPE1]

	DE_STATIC_ASSERT(TYPE_LAST	<= (1<<7));
	DE_STATIC_ASSERT(OP_LAST	<= (1<<5));

#define PACK_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE)	(((OP) << 14) | ((IN0DATATYPE) << 7) | (IN1DATATYPE))

#define MAKE_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE)	\
	case PACK_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE):	\
		return Evaluator<OP, IN0DATATYPE, IN1DATATYPE>::evaluate

#define MAKE_SCALAR_OPS(IN0DATATYPE, IN1DATATYPE)		\
	MAKE_EVAL_CASE(OP_ADD, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_MUL, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV, IN0DATATYPE, IN1DATATYPE)

#define MAKE_CWISE_OPS(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_ADD,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_COMP_MUL,	IN0DATATYPE, IN1DATATYPE)

#define MAKE_MUL_OP(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_MUL, IN0DATATYPE, IN1DATATYPE)

#define MAKE_VECVEC_OP(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_OUTER_PRODUCT, IN0DATATYPE, IN1DATATYPE)

#define MAKE_UNARY_OP(IN0DATATYPE)								\
	MAKE_EVAL_CASE(OP_TRANSPOSE,		IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_UNARY_PLUS,		IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_NEGATION,			IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_INCREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_DECREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_INCREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_DECREMENT,	IN0DATATYPE, TYPE_LAST)

#define MAKE_UNARY_SYMMETRIC_OP(IN0DATATYPE)					\
	MAKE_UNARY_OP(IN0DATATYPE);									\
	MAKE_EVAL_CASE(OP_DETERMINANT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_INVERSE,		IN0DATATYPE, TYPE_LAST)

#define MAKE_ASSIGNMENT_OP(IN0DATATYPE)								\
	MAKE_EVAL_CASE(OP_ADD_INTO,			IN0DATATYPE, IN0DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUBTRACT_FROM,	IN0DATATYPE, IN0DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIVIDE_INTO,		IN0DATATYPE, IN0DATATYPE)

#define MAKE_ASSIGNMENT_SYMMETRIC_OP(IN0DATATYPE)					\
	MAKE_ASSIGNMENT_OP(IN0DATATYPE);								\
	MAKE_EVAL_CASE(OP_MULTIPLY_INTO,	IN0DATATYPE, IN0DATATYPE)

	switch (PACK_EVAL_CASE(op, in0.dataType, in1.dataType))
	{
		// Matrix-scalar.
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4,	TYPE_FLOAT);

		// Matrix-vector.
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT_VEC4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT_VEC4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,	TYPE_FLOAT_VEC4);

		// Vector-matrix.
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT4X2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT4X3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT4);

		// Matrix-matrix.
		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT_MAT4X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT4);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT_MAT4X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT4);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT4);

		// Vector-vector.
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC4);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC4);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC4);

		// Unary Matrix.
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT2);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT2X3);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT2X4);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT3X2);
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT3);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT3X4);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT4X2);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT4X3);
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT4);

		// Assignments
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT2);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT2X3);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT2X4);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT3X2);
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT3);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT3X4);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT4X2);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT4X3);
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT4);

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}

#undef PACK_EVAL_CASE
#undef MAKE_EVAL_CASE
#undef MUL_OP
#undef ALL_OPS
#undef MAKE_MAT_SCALAR_VEC_CASES
#undef MAKE_MAT_MAT_CASES
}